

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O1

ActionResults * __thiscall BlueRoomFourAction::Use(BlueRoomFourAction *this)

{
  itemType iVar1;
  ItemWrapper *pIVar2;
  ActionResults *this_00;
  char *pcVar3;
  string information;
  itemType local_64;
  undefined1 *local_60;
  char *local_58;
  undefined1 local_50 [16];
  string local_40;
  
  local_58 = (char *)0x0;
  local_50[0] = 0;
  local_60 = local_50;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 != ROPE) {
    this_00 = AbstractRoomAction::Use(&this->super_AbstractRoomAction);
    goto LAB_00122a00;
  }
  iVar1 = Command::getActedOnItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == WHITE_PILLAR) {
    this->whitePillarRope = true;
    if (this->blackPillarRope == true) {
      local_64 = ROPE;
      pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_64);
      ItemWrapper::setLocation(pIVar2,HIDDEN);
      local_64 = BALL;
      pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_64);
      ItemWrapper::setLocation(pIVar2,WON);
LAB_00122967:
      pcVar3 = 
      "You tie the other end of the rope to the other pillar. Suddenly the rope sinks into the ground, pulling the pillars to the center. The walls have shifted and reveal a door to the north."
      ;
    }
    else {
      pcVar3 = "You tie the rope to the hook on the white pillar";
    }
  }
  else {
    iVar1 = Command::getActedOnItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == BLACK_PILLAR) {
      this->blackPillarRope = true;
      if (this->whitePillarRope == true) {
        local_64 = ROPE;
        pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_64);
        ItemWrapper::setLocation(pIVar2,HIDDEN);
        local_64 = BALL;
        pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_64);
        ItemWrapper::setLocation(pIVar2,WON);
        goto LAB_00122967;
      }
      pcVar3 = "You tie the rope to hook on the black pillar";
    }
    else {
      pcVar3 = "You can\'t use the rope on that.";
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_60,0,local_58,(ulong)pcVar3);
  this_00 = (ActionResults *)operator_new(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_60,local_58 + (long)local_60);
  ActionResults::ActionResults(this_00,CURRENT,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
LAB_00122a00:
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return this_00;
}

Assistant:

ActionResults * BlueRoomFourAction::Use() {
    std::string information;
    switch(commands->getMainItem()) {
        case ROPE :
            if (commands->getActedOnItem() == WHITE_PILLAR) {
                if(blackPillarRope){
                    whitePillarRope = true;
                    itemList->getValue(ROPE)->setLocation(HIDDEN);
                    itemList->getValue(BALL)->setLocation(WON);
                    information = "You tie the other end of the rope to the other pillar. "
                    "Suddenly the rope sinks into the ground, pulling the pillars to the center. "
                    "The walls have shifted and reveal a door to the north.";
                    break;
                }

                whitePillarRope = true;
                information = "You tie the rope to the hook on the white pillar";
            } else if (commands->getActedOnItem() == BLACK_PILLAR) {
                if(whitePillarRope){
                    blackPillarRope = true;
                    itemList->getValue(ROPE)->setLocation(HIDDEN);
                    itemList->getValue(BALL)->setLocation(WON);
                    information = "You tie the other end of the rope to the other pillar. "
                            "Suddenly the rope sinks into the ground, pulling the pillars to the center. "
                            "The walls have shifted and reveal a door to the north.";
                    break;
                }
                blackPillarRope = true;
                information = "You tie the rope to hook on the black pillar";
            } else {
                information= "You can't use the rope on that.";
            }
            break;
        default:
            return AbstractRoomAction::Use();
    }
    return new ActionResults(CURRENT, information);
}